

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::CallRegExFunction<2>
              (RecyclableObject *fnObj,Var regExp,Arguments *args,ScriptContext *scriptContext)

{
  bool bVar1;
  ImplicitCallFlags IVar2;
  ThreadContext *this;
  bool bVar3;
  Attributes attributes;
  Var pvVar4;
  RecyclableObject *ptr;
  anon_class_40_4_a3bf5f9f local_50;
  
  local_50.args.Info = args->Info;
  if ((local_50.args.Info._0_4_ & 0xffffff) < 3) {
    pvVar4 = CallRegExFunction<1>(fnObj,regExp,args,scriptContext);
    return pvVar4;
  }
  this = scriptContext->threadContext;
  local_50.args.Values = args->Values;
  bVar1 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_50.threadContext = this;
  local_50.fnObj = fnObj;
  local_50.regExp = regExp;
  attributes = FunctionInfo::GetAttributes(fnObj);
  bVar3 = ThreadContext::HasNoSideEffect(this,fnObj,attributes);
  if (bVar3) {
    ptr = (RecyclableObject *)CallRegExFunction<2>::anon_class_40_4_a3bf5f9f::operator()(&local_50);
    bVar3 = ThreadContext::IsOnStack(ptr);
  }
  else {
    if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
      ptr = (((((((((fnObj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
      goto LAB_00bbedac;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar2 = this->implicitCallFlags;
      ptr = (RecyclableObject *)
            CallRegExFunction<2>::anon_class_40_4_a3bf5f9f::operator()(&local_50);
      this->implicitCallFlags = IVar2 | ImplicitCall_Accessor;
      goto LAB_00bbedac;
    }
    ptr = (RecyclableObject *)CallRegExFunction<2>::anon_class_40_4_a3bf5f9f::operator()(&local_50);
    bVar3 = ThreadContext::IsOnStack(ptr);
  }
  if (bVar3 != false) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00bbedac:
  this->reentrancySafeOrHandled = bVar1;
  return ptr;
}

Assistant:

Var JavascriptString::CallRegExFunction<2>(RecyclableObject* fnObj, Var regExp, Arguments& args, ScriptContext * scriptContext)
    {
        // args[0]: String
        // args[1]: RegExp (ignored since we need to create one when the argument is "undefined")
        // args[2]: Var

        if (args.Info.Count < 3)
        {
            return CallRegExFunction<1>(fnObj, regExp, args, scriptContext);
        }

        ThreadContext * threadContext = scriptContext->GetThreadContext();
        return threadContext->ExecuteImplicitCall(fnObj, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, fnObj, CallInfo(CallFlags_Value, 3), regExp, args[0], args[2]);
        });
    }